

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O0

void __thiscall
ECdecoding::updateState
          (ECdecoding *this,SeqEntry *sequence,bool hit,char2double *nextProbs,char base,
          int increNum)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  type ppVar4;
  size_type sVar5;
  reference pvVar6;
  type pdVar7;
  size_t in_RCX;
  byte in_DL;
  double *in_RSI;
  SeqEntry *in_RDI;
  char in_R8B;
  int in_R9D;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  double penalty;
  key_type *in_stack_fffffffffffffa68;
  string2stringVec *__x;
  char __c;
  pair<int,_SeqEntry> *in_stack_fffffffffffffa70;
  pair<int,_SeqEntry> *this_00;
  key_type *in_stack_fffffffffffffa80;
  value_type_conflict2 vVar11;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa88;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa90;
  ECdecoding *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  pair<int,_SeqEntry> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffb38;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffb40;
  SeqEntry *in_stack_fffffffffffffce8;
  ECdecoding *in_stack_fffffffffffffcf0;
  double local_2c8;
  undefined1 extraout_var [56];
  
  Deflate::write((Deflate *)(in_RSI + 6),(int)in_RSI + 0x128,(void *)(ulong)(uint)(int)in_R8B,in_RCX
                );
  if ((*(byte *)((long)in_RSI + 0x116) & 1) == 0) {
    if ((((*(byte *)((long)in_RSI + 0x11c) & 1) == 0) && (*(int *)(in_RSI + 0x23) != 0)) &&
       (sVar3 = robin_hood::detail::
                Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80), sVar3 == 0)) {
      in_stack_fffffffffffffa90 =
           (Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(in_RDI->freq).super_ProbabilityEval.motif;
      std::pair<int,_SeqEntry>::pair<int,_SeqEntry_&,_true>
                (in_stack_fffffffffffffa70,(int *)in_stack_fffffffffffffa68,(SeqEntry *)0x186e77);
      robin_hood::detail::
      Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string&,std::pair<int,SeqEntry>>
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
      std::pair<int,_SeqEntry>::~pair((pair<int,_SeqEntry> *)0x186ea2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    }
    FreqTable::calcNewFreqs
              ((FreqTable *)in_stack_fffffffffffffa70,
               (char)((ulong)in_stack_fffffffffffffa68 >> 0x38));
    auVar9 = (undefined1  [16])0x0;
    local_2c8 = 0.0;
    ppVar4 = robin_hood::detail::
             Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::at<std::pair<int,SeqEntry>>
                       (in_stack_fffffffffffffa90,(key_type *)in_stack_fffffffffffffa88);
    if (ppVar4->first != 0) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      auVar10._0_8_ =
           nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator_double<double,_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)0x186f87);
      auVar10._8_56_ = extraout_var;
      auVar9 = auVar10._0_16_;
      local_2c8 = auVar10._0_8_;
    }
    if ((in_DL & 1) == 0) {
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (in_RSI + 1));
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      iVar2 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator_int<int,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)0x187001);
      auVar9 = vcvtusi2sd_avx512f(auVar9,sVar5 / (ulong)(long)iVar2);
      local_2c8 = auVar9._0_8_ + local_2c8;
    }
    pvVar6 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)in_stack_fffffffffffffa70,
                        (size_type)in_stack_fffffffffffffa68);
    vVar11 = *pvVar6;
    pdVar7 = robin_hood::detail::
             Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
             operator[]<double>((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                                 *)in_stack_fffffffffffffad0,
                                (key_type *)
                                CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    dVar8 = codewordFunc(*pdVar7);
    *in_RSI = *in_RSI - ((vVar11 + dVar8) - local_2c8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa70,(char)((ulong)in_stack_fffffffffffffa68 >> 0x38));
    *(int *)(in_RSI + 5) = in_R9D + *(int *)(in_RSI + 5);
    if ((*(int *)(in_RSI + 5) == 1) &&
       (bVar1 = robin_hood::detail::
                Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::contains((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68), !bVar1)) {
      __x = &(in_RDI->freq).super_ProbabilityEval.motif;
      this_00 = (pair<int,_SeqEntry> *)(in_RSI + 1);
      std::pair<int,_SeqEntry>::pair<int,_SeqEntry_&,_true>(this_00,(int *)__x,(SeqEntry *)0x187145)
      ;
      __c = (char)((ulong)__x >> 0x38);
      robin_hood::detail::
      Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string&,std::pair<int,SeqEntry>>
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
      std::pair<int,_SeqEntry>::~pair((pair<int,_SeqEntry> *)0x187169);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__c);
    }
    queueInsert(in_stack_fffffffffffffab0,in_RDI);
  }
  else {
    checkpointCheck(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  return;
}

Assistant:

void ECdecoding::updateState(SeqEntry &sequence,
                             bool hit, char2double &nextProbs, char base, int increNum) {
    sequence.ac.write(sequence.freq, (int) base);
    if (sequence.ac.bitout.failedSync) {
        checkpointCheck(sequence);
    } else {
        if (!sequence.ac.bitout.crcFlag && sequence.ac.bitout.bCount) {
            // crcFlag is off (just had a crc check) and the crc check was passed successful.
            if (!crcCheckpoints.count(sequence.seq)) {
                crcCheckpoints.emplace(sequence.seq, std::pair(0, sequence));
                sequence.lastCrc = sequence.seq;
            }
        }
        sequence.freq.calcNewFreqs(base);

        double penalty = 0;
        //int failCount = crcCheckpoints.at(sequence.lastCrc).first;
        if (crcCheckpoints.at(sequence.lastCrc).first)
            penalty = config["decode"]["metric"]["penalties"]["crc"]; //0.6
        if (!hit) {
            penalty += (sequence.seq.size() / static_cast<int>(config["decode"]["metric"]["penalties"]["no_hit"]));
        }

        sequence.metric -= (fanos[hit] + codewordFunc(nextProbs[base]) - penalty);
        sequence.seq += base;
        sequence.pos += increNum;

        // Put the first bases in the crc check hashmap, so that subtrees can get metric penalties
        // if the subtree fails multiple times at the same crc checkpoint. This should
        // reduce the probability of getting stuck in a local optima.
        if (sequence.pos == 1 && !crcCheckpoints.contains(sequence.seq)) {
            crcCheckpoints.emplace(sequence.seq, std::pair(0, sequence));
            sequence.lastCrc = base;
        }
        queueInsert(sequence);
    }
}